

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::keyReleaseEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  QWidgetPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QWidgetPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar1 = isReadOnly(this);
  if (!bVar1) {
    QWidgetPrivate::handleSoftwareInputPanel(this_00,false);
  }
  QWidget::keyReleaseEvent((QWidget *)this,e);
  return;
}

Assistant:

void QPlainTextEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();

#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (!e->isAutoRepeat() && e->key() == Qt::Key_Back
            && d->deleteAllTimer.isActive()) {
            d->deleteAllTimer.stop();
            QTextCursor cursor = d->control->textCursor();
            QTextBlockFormat blockFmt = cursor.blockFormat();

            QTextList *list = cursor.currentList();
            if (list && cursor.atBlockStart()) {
                list->remove(cursor.block());
            } else if (cursor.atBlockStart() && blockFmt.indent() > 0) {
                blockFmt.setIndent(blockFmt.indent() - 1);
                cursor.setBlockFormat(blockFmt);
            } else {
                cursor.deletePreviousChar();
            }
            setTextCursor(cursor);
        }
    }
#else
    QWidget::keyReleaseEvent(e);
#endif
}